

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O2

int luaopen_mongo_driver(lua_State *L)

{
  luaL_Reg l [9];
  
  luaL_checkversion_(L,503.0,0x88);
  memcpy(l,&PTR_anon_var_dwarf_17ee3_001608a0,0x90);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,8);
  luaL_setfuncs(L,l,0);
  return 1;
}

Assistant:

int
luaopen_mongo_driver(lua_State *L) {
	luaL_checkversion(L);
	luaL_Reg l[] ={
		{ "query", op_query },
		{ "reply", op_reply },
		{ "kill", op_kill },
		{ "delete", op_delete },
		{ "more", op_get_more },
		{ "update", op_update },
		{ "insert", op_insert },
		{ "length", reply_length },
		{ NULL, NULL },
	};

	luaL_newlib(L,l);
	return 1;
}